

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gc.cpp
# Opt level: O0

void __thiscall Gc_SpawnOne_Test::~Gc_SpawnOne_Test(Gc_SpawnOne_Test *this)

{
  Gc_SpawnOne_Test *this_local;
  
  ~Gc_SpawnOne_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (Gc, SpawnOne) {
    constexpr auto path = "db-path";

    test_watch_thread gc;
    expect_call (gc, path, make_process_id ());

    std::thread thread{[&gc] () { gc.watcher (); }};
    // Initiate garbage collection of the pstore file at path.
    gc.start_vacuum (path);
    // Our simulation never indicates that the GC process has exited. Therefore a second GC
    // request should be ignored.
    gc.start_vacuum (path);

    gc.stop ();
    thread.join ();
}